

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-dtoa.cc
# Opt level: O3

void TestDtoaSign(void)

{
  char *pcVar1;
  undefined8 uVar2;
  bool sign;
  int length;
  int point;
  char buffer_container [100];
  bool local_81;
  int local_80;
  int local_7c;
  char local_78 [104];
  
  double_conversion::DoubleToStringConverter::DoubleToAscii
            (0.0,SHORTEST,0,local_78,100,&local_81,&local_80,&local_7c);
  if (local_81 == true) {
    pcVar1 = "!sign";
    uVar2 = 0x159;
  }
  else {
    double_conversion::DoubleToStringConverter::DoubleToAscii
              (-0.0,SHORTEST,0,local_78,100,&local_81,&local_80,&local_7c);
    if (local_81 == false) {
      pcVar1 = "sign";
      uVar2 = 0x15c;
    }
    else {
      double_conversion::DoubleToStringConverter::DoubleToAscii
                (1.0,SHORTEST,0,local_78,100,&local_81,&local_80,&local_7c);
      if (local_81 == true) {
        pcVar1 = "!sign";
        uVar2 = 0x15f;
      }
      else {
        double_conversion::DoubleToStringConverter::DoubleToAscii
                  (-1.0,SHORTEST,0,local_78,100,&local_81,&local_80,&local_7c);
        if (local_81 == false) {
          pcVar1 = "sign";
          uVar2 = 0x162;
        }
        else {
          double_conversion::DoubleToStringConverter::DoubleToAscii
                    (0.0,SHORTEST_SINGLE,0,local_78,100,&local_81,&local_80,&local_7c);
          if (local_81 == true) {
            pcVar1 = "!sign";
            uVar2 = 0x165;
          }
          else {
            double_conversion::DoubleToStringConverter::DoubleToAscii
                      (-0.0,SHORTEST_SINGLE,0,local_78,100,&local_81,&local_80,&local_7c);
            if (local_81 == false) {
              pcVar1 = "sign";
              uVar2 = 0x168;
            }
            else {
              double_conversion::DoubleToStringConverter::DoubleToAscii
                        (1.0,SHORTEST_SINGLE,0,local_78,100,&local_81,&local_80,&local_7c);
              if (local_81 == true) {
                pcVar1 = "!sign";
                uVar2 = 0x16b;
              }
              else {
                double_conversion::DoubleToStringConverter::DoubleToAscii
                          (-1.0,SHORTEST_SINGLE,0,local_78,100,&local_81,&local_80,&local_7c);
                if (local_81 == false) {
                  pcVar1 = "sign";
                  uVar2 = 0x16e;
                }
                else {
                  double_conversion::DoubleToStringConverter::DoubleToAscii
                            (0.0,PRECISION,1,local_78,100,&local_81,&local_80,&local_7c);
                  if (local_81 == true) {
                    pcVar1 = "!sign";
                    uVar2 = 0x171;
                  }
                  else {
                    double_conversion::DoubleToStringConverter::DoubleToAscii
                              (-0.0,PRECISION,1,local_78,100,&local_81,&local_80,&local_7c);
                    if (local_81 == false) {
                      pcVar1 = "sign";
                      uVar2 = 0x174;
                    }
                    else {
                      double_conversion::DoubleToStringConverter::DoubleToAscii
                                (1.0,PRECISION,1,local_78,100,&local_81,&local_80,&local_7c);
                      if (local_81 == true) {
                        pcVar1 = "!sign";
                        uVar2 = 0x177;
                      }
                      else {
                        double_conversion::DoubleToStringConverter::DoubleToAscii
                                  (-1.0,PRECISION,1,local_78,100,&local_81,&local_80,&local_7c);
                        if (local_81 == false) {
                          pcVar1 = "sign";
                          uVar2 = 0x17a;
                        }
                        else {
                          double_conversion::DoubleToStringConverter::DoubleToAscii
                                    (0.0,FIXED,1,local_78,100,&local_81,&local_80,&local_7c);
                          if (local_81 == true) {
                            pcVar1 = "!sign";
                            uVar2 = 0x17d;
                          }
                          else {
                            double_conversion::DoubleToStringConverter::DoubleToAscii
                                      (-0.0,FIXED,1,local_78,100,&local_81,&local_80,&local_7c);
                            if (local_81 == false) {
                              pcVar1 = "sign";
                              uVar2 = 0x180;
                            }
                            else {
                              double_conversion::DoubleToStringConverter::DoubleToAscii
                                        (1.0,FIXED,1,local_78,100,&local_81,&local_80,&local_7c);
                              if (local_81 == true) {
                                pcVar1 = "!sign";
                                uVar2 = 0x183;
                              }
                              else {
                                double_conversion::DoubleToStringConverter::DoubleToAscii
                                          (-1.0,FIXED,1,local_78,100,&local_81,&local_80,&local_7c);
                                if (local_81 != false) {
                                  return;
                                }
                                pcVar1 = "sign";
                                uVar2 = 0x186;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s:%d:\n CHECK(%s) failed\n",
         "/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-dtoa.cc"
         ,uVar2,pcVar1);
  abort();
}

Assistant:

TEST(DtoaSign) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  bool sign;
  int length;
  int point;

  DoubleToAscii(0.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, SHORTEST, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0f, SHORTEST_SINGLE, 0, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, PRECISION, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(0.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-0.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(sign);

  DoubleToAscii(1.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(!sign);

  DoubleToAscii(-1.0, FIXED, 1, buffer, &sign, &length, &point);
  CHECK(sign);
}